

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O1

base_learner * ftrl_setup(options_i *options,vw *all)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  vw *pvVar3;
  size_t *psVar4;
  undefined8 uVar5;
  options_i *this;
  int iVar6;
  option_group_definition *poVar7;
  ostream *poVar8;
  typed_option<unsigned_long> *ptVar9;
  size_t sVar10;
  learner<ftrl,_example> *plVar11;
  uint32_t *puVar12;
  code *predict;
  code *pcVar13;
  float fVar14;
  bool pistol;
  bool ftrl_option;
  free_ptr<ftrl> b;
  string algorithm_name;
  option_group_definition new_options;
  bool local_6a2;
  bool local_6a1;
  free_ptr<ftrl> local_6a0;
  options_i *local_690;
  undefined1 *local_688 [2];
  undefined1 local_678 [16];
  undefined1 *local_668 [2];
  undefined1 local_658 [16];
  string local_648;
  undefined1 *local_628 [2];
  undefined1 local_618 [16];
  string local_608;
  undefined1 local_5e8 [112];
  bool local_578;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_560;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_550;
  undefined1 *local_548;
  long local_540;
  undefined1 local_538 [16];
  undefined1 *local_528 [2];
  undefined1 local_518 [16];
  string local_508;
  string local_4e8;
  option_group_definition local_4c8;
  undefined1 local_490 [112];
  bool local_420;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  undefined1 local_3f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  undefined1 local_350 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  typed_option<float> local_2b0;
  typed_option<float> local_210;
  typed_option<bool> local_170;
  typed_option<bool> local_d0;
  
  local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>._M_head_impl
       = calloc_or_throw<ftrl>(1);
  (local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->all = (vw *)0x0;
  (local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->ftrl_alpha = 0.0;
  (local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->ftrl_beta = 0.0;
  ((local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).update = 0.0;
  ((local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).ftrl_alpha = 0.0;
  ((local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).ftrl_beta = 0.0;
  ((local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).l1_lambda = 0.0;
  ((local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).l2_lambda = 0.0;
  ((local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).predict = 0.0;
  (local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->no_win_counter = 0;
  (local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->early_stop_thres = 0;
  local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)destroy_free<ftrl>;
  local_6a1 = false;
  local_6a2 = false;
  local_548 = local_538;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_548,"Follow the Regularized Leader","");
  paVar1 = &local_4c8.m_name.field_2;
  local_4c8.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_4c8,local_548,local_548 + local_540);
  local_4c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_548 != local_538) {
    operator_delete(local_548);
  }
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"ftrl","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_5e8,&local_608,&local_6a1);
  local_578 = true;
  local_628[0] = local_618;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_628,"FTRL: Follow the Proximal Regularized Leader","");
  std::__cxx11::string::_M_assign((string *)(local_5e8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_5e8);
  poVar7 = VW::config::option_group_definition::add<bool>(&local_4c8,&local_d0);
  local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"pistol","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_490,&local_648,&local_6a2);
  local_420 = true;
  local_668[0] = local_658;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_668,"FTRL beta parameter","");
  std::__cxx11::string::_M_assign((string *)(local_490 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_490);
  local_690 = options;
  poVar7 = VW::config::option_group_definition::add<bool>(poVar7,&local_170);
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"ftrl_alpha","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_350,&local_4e8,
             &(local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>
              ._M_head_impl)->ftrl_alpha);
  local_688[0] = local_678;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_688,"Learning rate for FTRL optimization","");
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_210,(typed_option<float> *)local_350);
  poVar7 = VW::config::option_group_definition::add<float>(poVar7,&local_210);
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"ftrl_beta","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_3f0,&local_508,
             &(local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>
              ._M_head_impl)->ftrl_beta);
  local_528[0] = local_518;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_528,"Learning rate for FTRL optimization","");
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_2b0,(typed_option<float> *)local_3f0);
  VW::config::option_group_definition::add<float>(poVar7,&local_2b0);
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbf98;
  if (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_528[0] != local_518) {
    operator_delete(local_528[0]);
  }
  local_3f0._0_8_ = &PTR__typed_option_002cbf98;
  if (local_358._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358._M_pi);
  }
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbf98;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_688[0] != local_678) {
    operator_delete(local_688[0]);
  }
  local_350._0_8_ = &PTR__typed_option_002cbf98;
  if (local_2b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
  }
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p);
  }
  this = local_690;
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbfd0;
  if (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_668[0] != local_658) {
    operator_delete(local_668[0]);
  }
  local_490._0_8_ = &PTR__typed_option_002cbfd0;
  if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
  }
  if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._M_dataplus._M_p != &local_648.field_2) {
    operator_delete(local_648._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbfd0;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_628[0] != local_618) {
    operator_delete(local_628[0]);
  }
  local_5e8._0_8_ = &PTR__typed_option_002cbfd0;
  if (local_550._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_550._M_pi);
  }
  if (local_560._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_560._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_5e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p);
  }
  (**this->_vptr_options_i)(this);
  if (local_6a1 == false) {
    if (local_6a2 == false) {
      plVar11 = (learner<ftrl,_example> *)0x0;
      goto LAB_002053e6;
    }
    if (local_6a2 == true) {
      pp_Var2 = (_func_int **)(local_5e8 + 0x10);
      local_5e8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"ftrl_alpha","");
      iVar6 = (*this->_vptr_options_i[1])(this,local_5e8);
      if ((char)iVar6 == '\0') {
        fVar14 = 1.0;
      }
      else {
        fVar14 = (local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_alpha;
      }
      (local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
      _M_head_impl)->ftrl_alpha = fVar14;
      if ((_func_int **)local_5e8._0_8_ != pp_Var2) {
        operator_delete((void *)local_5e8._0_8_);
      }
      local_5e8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"ftrl_beta","");
      iVar6 = (*this->_vptr_options_i[1])(this);
      if ((char)iVar6 != '\0') goto LAB_00205005;
      fVar14 = 0.5;
      goto LAB_00205019;
    }
  }
  else {
    pp_Var2 = (_func_int **)(local_5e8 + 0x10);
    local_5e8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"ftrl_alpha","");
    iVar6 = (*this->_vptr_options_i[1])(this,local_5e8);
    if ((char)iVar6 == '\0') {
      fVar14 = 0.005;
    }
    else {
      fVar14 = (local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_alpha;
    }
    (local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
    _M_head_impl)->ftrl_alpha = fVar14;
    if ((_func_int **)local_5e8._0_8_ != pp_Var2) {
      operator_delete((void *)local_5e8._0_8_);
    }
    local_5e8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"ftrl_beta","");
    iVar6 = (*this->_vptr_options_i[1])(this);
    if ((char)iVar6 == '\0') {
      fVar14 = 0.1;
    }
    else {
LAB_00205005:
      fVar14 = (local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_beta;
    }
LAB_00205019:
    (local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
    _M_head_impl)->ftrl_beta = fVar14;
    if ((undefined1 *)local_5e8._0_8_ != local_5e8 + 0x10) {
      operator_delete((void *)local_5e8._0_8_);
    }
  }
  (local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->all = all;
  (local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->no_win_counter = 0;
  pp_Var2 = (_func_int **)(local_5e8 + 0x10);
  local_5e8._8_8_ = (pointer)0x0;
  local_5e8[0x10] = 0;
  local_5e8._0_8_ = pp_Var2;
  if (local_6a1 == true) {
    std::__cxx11::string::_M_replace((ulong)local_5e8,0,(char *)0x0,0x27bb88);
    pcVar13 = learn_proximal<false>;
    if (all->audit != false) {
      pcVar13 = learn_proximal<true>;
    }
  }
  else if (local_6a2 == true) {
    std::__cxx11::string::_M_replace((ulong)local_5e8,0,(char *)0x0,0x27bb96);
    pcVar13 = learn_pistol;
  }
  else {
    pcVar13 = (_func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr *)0x0;
  }
  fVar14 = (local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
           _M_head_impl)->ftrl_beta;
  ((local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).ftrl_alpha =
       (local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
        super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
       _M_head_impl)->ftrl_alpha;
  ((local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).ftrl_beta = fVar14;
  pvVar3 = (local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
           _M_head_impl)->all;
  ((local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).l1_lambda = pvVar3->l1_lambda;
  ((local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).l2_lambda = pvVar3->l2_lambda;
  if ((all->weights).sparse == true) {
    sparse_parameters::stride_shift(&(all->weights).sparse_weights,2);
  }
  else {
    (all->weights).dense_weights._stride_shift = 2;
  }
  if (all->quiet == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Enabling FTRL based optimization",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Algorithm used: ",0x10);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_5e8._0_8_,local_5e8._8_8_);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ftrl_alpha = ",0xd);
    poVar8 = std::ostream::_M_insert<double>
                       ((double)(local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                                 super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                                 super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_alpha);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ftrl_beta = ",0xc);
    poVar8 = std::ostream::_M_insert<double>
                       ((double)(local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                                 super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                                 super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_beta);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  if (all->holdout_set_off == false) {
    all->sd->holdout_best_loss = 3.4028234663852886e+38;
    local_490._0_8_ = local_490 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"early_terminate","");
    ptVar9 = VW::config::options_i::get_typed_option<unsigned_long>(this,(string *)local_490);
    psVar4 = (ptVar9->m_value).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (psVar4 == (size_t *)0x0) {
      sVar10 = 0;
    }
    else {
      sVar10 = *psVar4;
    }
    (local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
    _M_head_impl)->early_stop_thres = sVar10;
    if ((undefined1 *)local_490._0_8_ != local_490 + 0x10) {
      operator_delete((void *)local_490._0_8_);
    }
  }
  predict = predict<false>;
  if (((all->hash_inv | all->audit) & 1U) != 0) {
    predict = predict<true>;
  }
  puVar12 = &(all->weights).dense_weights._stride_shift;
  if ((all->weights).sparse != false) {
    puVar12 = &(all->weights).sparse_weights._stride_shift;
  }
  plVar11 = LEARNER::init_learner<ftrl,example,LEARNER::learner<char,example>>
                      (&local_6a0,pcVar13,predict,1L << ((byte)*puVar12 & 0x3f));
  uVar5 = *(undefined8 *)(plVar11 + 0x18);
  *(undefined8 *)(plVar11 + 0x48) = uVar5;
  *(code **)(plVar11 + 0x50) = sensitivity;
  pcVar13 = multipredict<false>;
  if (((all->hash_inv | all->audit) & 1U) != 0) {
    pcVar13 = multipredict<true>;
  }
  *(code **)(plVar11 + 0x40) = pcVar13;
  *(code **)(plVar11 + 0x80) = save_load;
  *(undefined8 *)(plVar11 + 0x70) = uVar5;
  *(undefined8 *)(plVar11 + 0x78) = *(undefined8 *)(plVar11 + 0x20);
  *(undefined8 *)(plVar11 + 0x88) = uVar5;
  *(undefined8 *)(plVar11 + 0x90) = *(undefined8 *)(plVar11 + 0x20);
  *(code **)(plVar11 + 0x98) = end_pass;
  if ((_func_int **)local_5e8._0_8_ != pp_Var2) {
    operator_delete((void *)local_5e8._0_8_);
  }
LAB_002053e6:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_4c8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_4c8.m_name._M_dataplus._M_p);
  }
  if (local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
      _M_head_impl != (ftrl *)0x0) {
    (*(code *)local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl)
              (local_6a0._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>
               ._M_head_impl);
  }
  return (base_learner *)plVar11;
}

Assistant:

base_learner* ftrl_setup(options_i& options, vw& all)
{
  auto b = scoped_calloc_or_throw<ftrl>();
  bool ftrl_option = false;
  bool pistol = false;

  option_group_definition new_options("Follow the Regularized Leader");
  new_options.add(make_option("ftrl", ftrl_option).keep().help("FTRL: Follow the Proximal Regularized Leader"))
      .add(make_option("pistol", pistol).keep().help("FTRL beta parameter"))
      .add(make_option("ftrl_alpha", b->ftrl_alpha).help("Learning rate for FTRL optimization"))
      .add(make_option("ftrl_beta", b->ftrl_beta).help("Learning rate for FTRL optimization"));
  options.add_and_parse(new_options);

  if (!ftrl_option && !pistol)
  {
    return nullptr;
  }

  // Defaults that are specific to the mode that was chosen.
  if (ftrl_option)
  {
    b->ftrl_alpha = options.was_supplied("ftrl_alpha") ? b->ftrl_alpha : 0.005f;
    b->ftrl_beta = options.was_supplied("ftrl_beta") ? b->ftrl_beta : 0.1f;
  }
  else if (pistol)
  {
    b->ftrl_alpha = options.was_supplied("ftrl_alpha") ? b->ftrl_alpha : 1.0f;
    b->ftrl_beta = options.was_supplied("ftrl_beta") ? b->ftrl_beta : 0.5f;
  }

  b->all = &all;
  b->no_win_counter = 0;

  void (*learn_ptr)(ftrl&, single_learner&, example&) = nullptr;

  string algorithm_name;
  if (ftrl_option)
  {
    algorithm_name = "Proximal-FTRL";
    if (all.audit)
      learn_ptr = learn_proximal<true>;
    else
      learn_ptr = learn_proximal<false>;
  }
  else if (pistol)
  {
    algorithm_name = "PiSTOL";
    learn_ptr = learn_pistol;
  }
  b->data.ftrl_alpha = b->ftrl_alpha;
  b->data.ftrl_beta = b->ftrl_beta;
  b->data.l1_lambda = b->all->l1_lambda;
  b->data.l2_lambda = b->all->l2_lambda;

  all.weights.stride_shift(2);  // NOTE: for more parameter storage

  if (!all.quiet)
  {
    cerr << "Enabling FTRL based optimization" << endl;
    cerr << "Algorithm used: " << algorithm_name << endl;
    cerr << "ftrl_alpha = " << b->ftrl_alpha << endl;
    cerr << "ftrl_beta = " << b->ftrl_beta << endl;
  }

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    b->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  learner<ftrl, example>* l;
  if (all.audit || all.hash_inv)
    l = &init_learner(b, learn_ptr, predict<true>, UINT64_ONE << all.weights.stride_shift());
  else
    l = &init_learner(b, learn_ptr, predict<false>, UINT64_ONE << all.weights.stride_shift());
  l->set_sensitivity(sensitivity);
  if (all.audit || all.hash_inv)
    l->set_multipredict(multipredict<true>);
  else
    l->set_multipredict(multipredict<false>);
  l->set_save_load(save_load);
  l->set_end_pass(end_pass);
  return make_base(*l);
}